

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O2

void __thiscall duckdb::ScanFilterInfo::SetFilterAlwaysTrue(ScanFilterInfo *this,idx_t filter_idx)

{
  reference pvVar1;
  reference rVar2;
  
  pvVar1 = vector<duckdb::ScanFilter,_true>::get<true>(&this->filter_list,filter_idx);
  if (pvVar1->always_true == false) {
    pvVar1->always_true = true;
    rVar2 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                      ((vector<bool,_std::allocator<bool>_> *)&this->column_has_filter,
                       pvVar1->scan_column_index);
    *rVar2._M_p = *rVar2._M_p & ~rVar2._M_mask;
    this->always_true_filters = this->always_true_filters + 1;
  }
  return;
}

Assistant:

void ScanFilterInfo::SetFilterAlwaysTrue(idx_t filter_idx) {
	auto &filter = filter_list[filter_idx];
	if (filter.always_true) {
		return;
	}
	filter.always_true = true;
	column_has_filter[filter.scan_column_index] = false;
	always_true_filters++;
}